

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O3

int __thiscall dlib::rand::rand(rand *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  EVP_PKEY_CTX *in_RSI;
  long local_40;
  string local_38;
  
  this->_vptr_rand = (_func_int **)&PTR__rand_001fa598;
  iVar3 = 1;
  (this->mt).x[0] = 0x1571;
  (this->mt).i = 1;
  do {
    uVar1 = (this->mt).x[(long)iVar3 + -1];
    (this->mt).x[iVar3] = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + iVar3;
    iVar2 = (this->mt).i;
    iVar3 = iVar2 + 1;
    (this->mt).i = iVar3;
  } while (iVar2 < 0x26f);
  (this->seed)._M_dataplus._M_p = (pointer)&(this->seed).field_2;
  (this->seed)._M_string_length = 0;
  (this->seed).field_2._M_local_buf[0] = '\0';
  init(this,in_RSI);
  cast_to_string<long>(&local_38,&local_40);
  set_seed(this,&local_38);
  paVar4 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar4) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    paVar4 = extraout_RAX;
  }
  return (int)paVar4;
}

Assistant:

rand (
                time_t seed_value
            )
            {
                init();
                set_seed(cast_to_string(seed_value));
            }